

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

void * new<Memory::NoThrowHeapAllocator>
                 (size_t byteSize,NoThrowHeapAllocator *alloc,bool nothrow,
                 offset_in_NoThrowHeapAllocator_to_subr AllocFunc)

{
  code *pcVar1;
  bool bVar2;
  void *pvVar3;
  long in_R8;
  undefined8 *in_FS_OFFSET;
  code *local_60;
  void *buffer;
  offset_in_NoThrowHeapAllocator_to_subr AllocFunc_local;
  bool nothrow_local;
  NoThrowHeapAllocator *alloc_local;
  size_t byteSize_local;
  
  if (!nothrow) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x219,"(nothrow)","nothrow");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if (byteSize == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x21a,"(byteSize != 0)","byteSize != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  local_60 = (code *)AllocFunc;
  if ((AllocFunc & 1) != 0) {
    local_60 = *(code **)(*(long *)(alloc + in_R8) + (AllocFunc - 1));
  }
  pvVar3 = (void *)(*local_60)(alloc + in_R8,byteSize);
  return pvVar3;
}

Assistant:

__cdecl
operator new(DECLSPEC_GUARD_OVERFLOW size_t byteSize, TAllocator * alloc, bool nothrow, char * (TAllocator::*AllocFunc)(size_t))
{
    Assert(nothrow);
    Assert(byteSize != 0);
    void * buffer = (alloc->*AllocFunc)(byteSize);
    return buffer;
}